

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O3

uint8_t * __thiscall SRUP_Crypto::DecryptF(SRUP_Crypto *this,char *keyfile)

{
  int iVar1;
  RSA *ctx;
  undefined4 extraout_var;
  size_t *in_RCX;
  uchar *out;
  uchar *in_R8;
  size_t in_R9;
  
  ctx = getPrivateKeyF(keyfile);
  if (ctx != (RSA *)0x0) {
    iVar1 = _decrypt(this,(EVP_PKEY_CTX *)ctx,out,in_RCX,in_R8,in_R9);
    return (uint8_t *)CONCAT44(extraout_var,iVar1);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* SRUP_Crypto::DecryptF(char *keyfile)
{
    RSA* key;
    key = getPrivateKeyF(keyfile);
    if (key != nullptr)
        return _decrypt(key);
    else
        return nullptr;
}